

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O0

error<idx2::idx2_err_code> idx2::FlushChunkExponents(idx2_file *Idx2,encode_data *E)

{
  long lVar1;
  undefined1 auVar2 [11];
  unsigned_long *puVar3;
  int iVar4;
  int iVar5;
  u64 *puVar6;
  size_t sVar7;
  hash_table<unsigned_long,_idx2::sub_channel> *Ht;
  hash_table<unsigned_long,_idx2::sub_channel> *extraout_RDX;
  hash_table<unsigned_long,_idx2::sub_channel> *Ht_00;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *phVar8;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *extraout_RDX_00;
  stref sVar9;
  error<idx2::idx2_err_code> eVar10;
  double local_548;
  double local_540;
  double local_520;
  double local_518;
  double local_4f8;
  double local_4f0;
  byte local_491;
  anon_class_1_0_00000001 local_459;
  undefined1 local_458 [24];
  buffer local_440;
  buffer local_428;
  undefined1 local_410 [24];
  undefined1 auStack_3f8 [8];
  buffer Buf;
  int TotalExpBytes;
  anon_union_8_2_2df48d06_for_stref_0 local_3b0;
  undefined4 local_3a8;
  anon_union_8_2_2df48d06_for_stref_0 local_3a0;
  int local_398;
  undefined1 local_390 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:173:5)>
  __ScopeGuard__173;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__173;
  FILE *Fp;
  file_id FileId;
  bitstream *ChunkExpSizes;
  chunk_exp_info *Ce;
  chunk_exp_info *local_338;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *local_330;
  undefined1 local_328 [8];
  iterator CeIt;
  sub_channel_info *Sch_1;
  long lStack_2f8;
  i16 BitPlane;
  u64 Brick;
  sub_channel_info ScInfo;
  sub_channel *local_2d0;
  hash_table<unsigned_long,_idx2::sub_channel> *local_2c8;
  undefined1 local_2c0 [8];
  iterator Sch;
  encode_data *E_local;
  idx2_file *Idx2_local;
  undefined5 uStack_285;
  int BytePos;
  double local_270;
  double *local_268;
  double local_260;
  double *local_258;
  double local_250;
  double *local_248;
  long *local_240;
  u64 local_238;
  long *local_230;
  long *local_228;
  u64 local_220;
  u64 local_218;
  i64 local_210;
  array<idx2::sub_channel_info> *local_208;
  hash_table<unsigned_long,_idx2::sub_channel> *local_200;
  long local_1f8;
  sub_channel **local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  long local_1d8;
  long local_1d0;
  u64 *local_1c8;
  undefined1 *local_1c0;
  ulong local_1b8;
  idx2_file *local_1b0;
  u64 *local_1a8;
  array<idx2::sub_channel_info> *local_1a0;
  undefined1 *local_198;
  i64 *local_190;
  undefined8 *local_188;
  long *local_180;
  long *local_178;
  chunk_exp_info **local_170;
  undefined1 *local_168;
  FILE *local_160;
  anon_union_8_2_2df48d06_for_stref_0 *local_158;
  undefined1 *local_150;
  FILE **local_148;
  undefined1 *local_140;
  FILE **local_138;
  undefined1 *local_130;
  FILE **local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  buffer *local_108;
  unsigned_long *local_100;
  unsigned_long *local_f8;
  undefined1 *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  double *local_90;
  i64 local_88;
  byte *local_80;
  byte *local_78;
  undefined1 *local_70;
  i64 local_68;
  byte *local_60;
  byte *local_58;
  undefined1 *local_50;
  byte local_41;
  ulong uStack_40;
  i8 I;
  uint local_34;
  stack_array<int,_16> *local_30;
  undefined1 local_21;
  ulong local_20;
  long local_18;
  array<idx2::sub_channel_info> *local_10;
  
  local_208 = &E->SortedSubChannels;
  local_200 = &E->SubChannels;
  local_210 = (E->SubChannels).Size;
  Sch.Idx = (i64)E;
  GrowCapacity<idx2::sub_channel_info>(local_208,local_210);
  local_1f8 = Sch.Idx + 0x370;
  *(undefined8 *)(Sch.Idx + 0x388) = 0;
  Begin<unsigned_long,idx2::sub_channel>((iterator *)local_2c0,(idx2 *)(Sch.Idx + 0x68),Ht);
  Ht_00 = extraout_RDX;
  while( true ) {
    End<unsigned_long,idx2::sub_channel>
              ((iterator *)&ScInfo.SubChannel,(idx2 *)(Sch.Idx + 0x68),Ht_00);
    local_1e8 = local_2c0;
    local_1f0 = &ScInfo.SubChannel;
    if (Sch.Val == local_2d0 && Sch.Ht == local_2c8) {
      local_188 = (undefined8 *)(Sch.Idx + 0x370);
      local_178 = (long *)(Sch.Idx + 0x370);
      InsertionSort<idx2::sub_channel_info*>
                ((sub_channel_info *)*local_188,
                 (sub_channel_info *)(*local_178 + *(long *)(Sch.Idx + 0x388) * 0x10));
      local_190 = (i64 *)(Sch.Idx + 0x370);
      CeIt.Idx = *local_190;
      while( true ) {
        local_180 = (long *)(Sch.Idx + 0x370);
        phVar8 = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)
                 (*(long *)(Sch.Idx + 0x388) * 0x10);
        if (CeIt.Idx == (long)&phVar8->Keys + *local_180) break;
        WriteChunkExponents(Idx2,(encode_data *)Sch.Idx,*(sub_channel **)(CeIt.Idx + 8),
                            *(i8 *)CeIt.Idx,*(i8 *)(CeIt.Idx + 1));
        CeIt.Idx = CeIt.Idx + 0x10;
      }
      Begin<unsigned_long,idx2::chunk_exp_info>
                ((iterator *)local_328,(idx2 *)(Sch.Idx + 0x220),phVar8);
      phVar8 = extraout_RDX_00;
      while( true ) {
        End<unsigned_long,idx2::chunk_exp_info>((iterator *)&Ce,(idx2 *)(Sch.Idx + 0x220),phVar8);
        puVar3 = CeIt.Key;
        local_168 = local_328;
        local_170 = &Ce;
        if (CeIt.Val == local_338 && CeIt.Ht == local_330) break;
        FileId.Id = (u64)CeIt.Key;
        ConstructFilePath((file_id *)&Fp,Idx2,*(u64 *)local_328);
        __CleanUpFunc__173.Fp = (FILE **)fopen((char *)Fp,"ab");
        __ScopeGuard__173._8_8_ = &__CleanUpFunc__173;
        scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:173:5)>
        ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:173:5)>
                       *)local_390,(anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__173.Dismissed)
        ;
        if (__CleanUpFunc__173.Fp == (FILE **)0x0) {
          local_158 = &local_3b0;
          local_160 = Fp;
          local_3b0.Ptr = (str)Fp;
          sVar7 = strlen((char *)Fp);
          local_3a8 = (undefined4)sVar7;
          sVar9 = GetParentPath((stref *)&local_3b0);
          local_3a0 = sVar9.field_0;
          local_398 = sVar9.Size;
          CreateFullDir((stref *)&local_3a0);
          __CleanUpFunc__173.Fp = (FILE **)fopen((char *)Fp,"ab");
        }
        **(undefined8 **)(FileId.Id + 0x18) = *(undefined8 *)(FileId.Id + 0x20);
        iVar4 = *(int *)(FileId.Id + 0x28) >> 3;
        if (0 < iVar4) {
          *(ulong *)(FileId.Id + 0x20) =
               (*(ulong *)(FileId.Id + 0x20) >> 1) >> ((char)(iVar4 << 3) - 1U & 0x3f);
        }
        *(long *)(FileId.Id + 0x18) = *(long *)(FileId.Id + 0x18) + (long)iVar4;
        *(uint *)(FileId.Id + 0x28) = *(uint *)(FileId.Id + 0x28) & 7;
        local_238 = FileId.Id;
        local_250 = (double)((*(long *)(FileId.Id + 0x18) - *(long *)FileId.Id) +
                            (long)((*(int *)(FileId.Id + 0x28) + 7) / 8));
        local_248 = &ExpChunkSizesStat;
        local_e0 = &ExpChunkSizesStat;
        local_e8 = &local_250;
        local_4f0 = local_250;
        if (ExpChunkSizesStat <= local_250) {
          local_4f0 = ExpChunkSizesStat;
        }
        ExpChunkSizesStat = local_4f0;
        local_b0 = &DAT_003004b8;
        local_b8 = &local_250;
        local_4f8 = local_250;
        if (local_250 <= DAT_003004b8) {
          local_4f8 = DAT_003004b8;
        }
        DAT_003004b8 = local_4f8;
        DAT_003004c0 = local_250 + DAT_003004c0;
        DAT_003004c8 = DAT_003004c8 + 1;
        DAT_003004d0 = local_250 * local_250 + DAT_003004d0;
        ToBuffer<unsigned_char>((buffer *)auStack_3f8,(array<unsigned_char> *)(puVar3 + 0xc));
        local_128 = __CleanUpFunc__173.Fp;
        local_130 = auStack_3f8;
        local_120 = local_130;
        fwrite((void *)auStack_3f8,(size_t)Buf.Data,1,(FILE *)__CleanUpFunc__173.Fp);
        iVar4 = (int)Buf.Data;
        local_220 = FileId.Id;
        auStack_3f8 = *(undefined1 (*) [8])FileId.Id;
        local_218 = FileId.Id;
        Buf.Data = (byte *)((*(long *)(FileId.Id + 0x18) - *(long *)FileId.Id) +
                           (long)((*(int *)(FileId.Id + 0x28) + 7) / 8));
        Buf.Bytes = *(i64 *)(FileId.Id + 0x10);
        local_70 = local_410;
        local_138 = __CleanUpFunc__173.Fp;
        local_140 = auStack_3f8;
        local_118 = local_140;
        local_88 = Buf.Bytes;
        local_80 = Buf.Data;
        local_78 = (byte *)auStack_3f8;
        fwrite((void *)auStack_3f8,(size_t)Buf.Data,1,(FILE *)__CleanUpFunc__173.Fp);
        WritePOD<int>((FILE *)__CleanUpFunc__173.Fp,(int)Buf.Data);
        iVar4 = (int)Buf.Data + iVar4;
        ToBuffer<unsigned_long>(&local_428,(array<unsigned_long> *)(puVar3 + 6));
        local_108 = &local_428;
        local_260 = (double)local_428.Bytes;
        local_258 = &UncompressedExpChunkAddressesStat;
        local_d0 = &UncompressedExpChunkAddressesStat;
        local_d8 = &local_260;
        local_518 = local_260;
        if (UncompressedExpChunkAddressesStat <= local_260) {
          local_518 = UncompressedExpChunkAddressesStat;
        }
        UncompressedExpChunkAddressesStat = local_518;
        local_a0 = &DAT_003004e0;
        local_a8 = &local_260;
        local_520 = local_260;
        if (local_260 <= DAT_003004e0) {
          local_520 = DAT_003004e0;
        }
        DAT_003004e0 = local_520;
        DAT_003004e8 = local_260 + DAT_003004e8;
        DAT_003004f0 = DAT_003004f0 + 1;
        DAT_003004f8 = local_260 * local_260 + DAT_003004f8;
        ToBuffer<unsigned_long>(&local_440,(array<unsigned_long> *)(puVar3 + 6));
        CompressBufZstd(&local_440,(bitstream *)(Sch.Idx + 0x250));
        local_240 = (long *)(Sch.Idx + 0x250);
        local_270 = (double)((*(long *)(Sch.Idx + 0x268) - *local_240) +
                            (long)((*(int *)(Sch.Idx + 0x278) + 7) / 8));
        local_268 = &CompressedExpChunkAddressesStat;
        local_c0 = &CompressedExpChunkAddressesStat;
        local_c8 = &local_270;
        local_540 = local_270;
        if (CompressedExpChunkAddressesStat <= local_270) {
          local_540 = CompressedExpChunkAddressesStat;
        }
        CompressedExpChunkAddressesStat = local_540;
        local_90 = &DAT_00300508;
        local_98 = &local_270;
        local_548 = local_270;
        if (local_270 <= DAT_00300508) {
          local_548 = DAT_00300508;
        }
        DAT_00300508 = local_548;
        DAT_00300510 = local_270 + DAT_00300510;
        DAT_00300518 = DAT_00300518 + 1;
        DAT_00300520 = local_270 * local_270 + DAT_00300520;
        local_230 = (long *)(Sch.Idx + 0x250);
        auStack_3f8 = (undefined1  [8])*local_230;
        Buf.Data = (byte *)((*(long *)(Sch.Idx + 0x268) - *local_230) +
                           (long)((*(int *)(Sch.Idx + 0x278) + 7) / 8));
        Buf.Bytes = *(i64 *)(Sch.Idx + 0x260);
        local_50 = local_458;
        local_148 = __CleanUpFunc__173.Fp;
        local_150 = auStack_3f8;
        local_228 = local_230;
        local_110 = local_150;
        local_68 = Buf.Bytes;
        local_60 = Buf.Data;
        local_58 = (byte *)auStack_3f8;
        fwrite((void *)auStack_3f8,(size_t)Buf.Data,1,(FILE *)__CleanUpFunc__173.Fp);
        WritePOD<int>((FILE *)__CleanUpFunc__173.Fp,(int)Buf.Data);
        iVar5 = (int)Buf.Data;
        local_100 = puVar3 + 6;
        WritePOD<int>((FILE *)__CleanUpFunc__173.Fp,(int)puVar3[9]);
        WritePOD<int>((FILE *)__CleanUpFunc__173.Fp,iVar4 + iVar5 + 0x10);
        local_f8 = CeIt.Key + 0xc;
        (**(code **)(*(long *)CeIt.Key[0x11] + 8))();
        local_f8[4] = 0;
        local_f8[3] = 0;
        scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:173:5)>
        ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:173:5)>
                        *)local_390);
        local_f0 = local_328;
        do {
          CeIt.Ht = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)((long)&(CeIt.Ht)->Keys + 1);
        } while (*(char *)((long)&(CeIt.Ht)->Keys +
                          (long)&(((CeIt.Val)->ExpSizes).Stream.Alloc)->_vptr_allocator) != '\x02');
        local_328 = (undefined1  [8])(((CeIt.Val)->ExpSizes).Stream.Data + (long)CeIt.Ht * 8);
        phVar8 = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)((long)CeIt.Ht * 0x90);
        CeIt.Key = (unsigned_long *)((long)&phVar8->Keys + ((CeIt.Val)->ExpSizes).Stream.Bytes);
      }
      eVar10 = FlushChunkExponents::anon_class_1_0_00000001::operator()(&local_459);
      auVar2 = eVar10._0_11_;
      eVar10._11_5_ = uStack_285;
      eVar10.Msg = (cstr)auVar2._0_8_;
      eVar10.Code = auVar2[8];
      eVar10.StackIdx = auVar2[9];
      eVar10.StrGened = (bool)auVar2[10];
      return eVar10;
    }
    sub_channel_info::sub_channel_info((sub_channel_info *)&Brick);
    local_1e0 = local_2c0;
    ScInfo._0_8_ = Sch.Key;
    local_1b8 = *(ulong *)local_2c0;
    local_1c8 = &Brick;
    local_1d0 = (long)&Brick + 1;
    local_1c0 = (undefined1 *)&stack0xfffffffffffffd08;
    local_1d8 = (long)&Sch_1 + 6;
    Sch_1._6_2_ = (short)(((int)local_1b8 << 0x14) >> 0x14);
    Brick._1_1_ = (byte)(local_1b8 >> 0xc) & 0x3f;
    Brick._0_1_ = (byte)(local_1b8 >> 0x3c);
    local_30 = &Idx2->BricksPerFile;
    local_34 = (uint)(char)(byte)Brick;
    local_1b0 = Idx2;
    if (0xf < local_34) break;
    uStack_40 = (ulong)local_30->Arr[(int)local_34];
    local_21 = 0xff;
    if (uStack_40 == 0) {
      local_491 = 0xff;
    }
    else {
      lVar1 = 0x3f;
      if (uStack_40 != 0) {
        for (; uStack_40 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      local_491 = 0x3f - ((byte)lVar1 ^ 0x3f);
    }
    local_41 = local_491;
    lStack_2f8 = (local_1b8 >> 0x12 & 0x3ffffffffff) <<
                 (local_491 + (uStack_40 != 1L << (local_491 & 0x3f)) & 0x3f);
    local_1a0 = (array<idx2::sub_channel_info> *)(Sch.Idx + 0x370);
    local_1a8 = &Brick;
    local_20 = uStack_40;
    if (*(long *)(Sch.Idx + 0x390) <= *(long *)(Sch.Idx + 0x388)) {
      GrowCapacity<idx2::sub_channel_info>(local_1a0,0);
    }
    local_18 = local_1a0->Size;
    local_1a0->Size = local_18 + 1;
    local_10 = local_1a0;
    puVar6 = (u64 *)((local_1a0->Buffer).Data + local_18 * 0x10);
    *puVar6 = *local_1a8;
    puVar6[1] = local_1a8[1];
    local_198 = local_2c0;
    do {
      Sch.Ht = (hash_table<unsigned_long,_idx2::sub_channel> *)((long)&(Sch.Ht)->Keys + 1);
    } while (*(char *)((long)&(Sch.Ht)->Keys +
                      (long)&(((Sch.Val)->BlockExpStream).Stream.Alloc)->_vptr_allocator) != '\x02')
    ;
    local_2c0 = (undefined1  [8])(((Sch.Val)->BlockExpStream).Stream.Data + (long)Sch.Ht * 8);
    Ht_00 = (hash_table<unsigned_long,_idx2::sub_channel> *)((long)Sch.Ht * 0x70);
    Sch.Key = (unsigned_long *)((long)&Ht_00->Keys + ((Sch.Val)->BlockExpStream).Stream.Bytes);
  }
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
}

Assistant:

error<idx2_err_code>
FlushChunkExponents(const idx2_file& Idx2, encode_data* E)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    Reserve(&E->SortedSubChannels, Size(E->SubChannels));
    Clear(&E->SortedSubChannels);
    idx2_ForEach (Sch, E->SubChannels)
    {
      sub_channel_info ScInfo;
      ScInfo.SubChannel = &*Sch;
      u64 Brick;
      i16 BitPlane;
      UnpackFileAddress(Idx2, *Sch.Key, &Brick, &ScInfo.Level, &ScInfo.Subband, &BitPlane);
      PushBack(&E->SortedSubChannels, ScInfo);
    }
    InsertionSort(Begin(E->SortedSubChannels), End(E->SortedSubChannels));

    idx2_ForEach (Sch, E->SortedSubChannels)
      WriteChunkExponents(Idx2, E, Sch->SubChannel, Sch->Level, Sch->Subband); //just call  WriteChunkExponents

    return idx2_Error(idx2_err_code::NoError);
  }
#endif

  Reserve(&E->SortedSubChannels, Size(E->SubChannels));
  Clear(&E->SortedSubChannels);
  idx2_ForEach (Sch, E->SubChannels)
  {
    sub_channel_info ScInfo;
    ScInfo.SubChannel = &*Sch;
    u64 Brick;
    i16 BitPlane;
    UnpackFileAddress(Idx2, *Sch.Key, &Brick, &ScInfo.Level, &ScInfo.Subband, &BitPlane);
    PushBack(&E->SortedSubChannels, ScInfo);
  }
  InsertionSort(Begin(E->SortedSubChannels), End(E->SortedSubChannels));

  idx2_ForEach (Sch, E->SortedSubChannels)
    WriteChunkExponents(Idx2, E, Sch->SubChannel, Sch->Level, Sch->Subband);
  // TODO: deallocate the file emax buffer after it is flushed to a file
  // TODO: need to "interleave" this with FlushChunk
  // TODO: detect that we are done with a file to flush it as soon as possible instead of at the end (maybe count the number of chunks in a file)
  // TODO: as soon as we get out of a spatial domain for a file, flush every files in the buffer
  // (since we know that all files in the buffer cannot be traversed again in the spatial DFS order)
  idx2_ForEach (CeIt, E->ChunkExponents) // one CeIt for each file
  {
    chunk_exp_info* Ce = CeIt.Val;
    bitstream* ChunkExpSizes = &Ce->ExpSizes;
    file_id FileId = ConstructFilePath(Idx2, *CeIt.Key);
    idx2_Assert(FileId.Id == *CeIt.Key);
    /* write chunk emax sizes */
    idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
    Flush(ChunkExpSizes);
    ExpChunkSizesStat.Add((f64)Size(*ChunkExpSizes));
    int TotalExpBytes = 0;
    // write the exponent buffer
    buffer Buf = ToBuffer(Ce->FileExpBuffer);
    WriteBuffer(Fp, Buf);
    TotalExpBytes += int(Buf.Bytes);
    // write the (compressed) sizes of the exponents
    Buf = ToBuffer(*ChunkExpSizes);
    WriteBuffer(Fp, Buf);
    WritePOD(Fp, (int)Buf.Bytes);
    TotalExpBytes += int(Buf.Bytes) + sizeof(int);
    // write compressed chunk addresses
    UncompressedExpChunkAddressesStat.Add((f64)Size(ToBuffer(Ce->Addrs)));
    CompressBufZstd(ToBuffer(Ce->Addrs), &E->CompressedChunkAddresses);
    CompressedExpChunkAddressesStat.Add((f64)Size(E->CompressedChunkAddresses));
    Buf = ToBuffer(E->CompressedChunkAddresses);
    WriteBuffer(Fp, Buf);
    WritePOD(Fp, (int)Buf.Bytes);
    TotalExpBytes += int(Buf.Bytes) + sizeof(int);
    // write number of chunks
    WritePOD(Fp, (int)Size(Ce->Addrs));
    TotalExpBytes += sizeof(int);
    // write the total number of bytes used for storing the exponents
    TotalExpBytes += sizeof(int);
    WritePOD(Fp, (int)TotalExpBytes);
    Dealloc(&CeIt.Val->FileExpBuffer);
  }

  return idx2_Error(idx2_err_code::NoError);
}